

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O0

void Omega_h::print_histogram(Histogram *histogram,string *name)

{
  double dVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  size_type sVar4;
  const_reference pvVar5;
  double dVar6;
  Real ceil;
  Real floor;
  Int i;
  Real interval;
  Int nbins;
  ios local_120 [8];
  ios saved_state;
  string *name_local;
  Histogram *histogram_local;
  
  std::ios::ios(local_120,(streambuf *)0x0);
  std::ios::copyfmt(local_120);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
  _Var2 = std::setprecision(2);
  std::operator<<(poVar3,_Var2);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)name);
  std::operator<<(poVar3," histogram:\n");
  sVar4 = std::vector<long,_std::allocator<long>_>::size(&histogram->bins);
  dVar6 = (histogram->max - histogram->min) / (double)(int)sVar4;
  for (floor._4_4_ = 0; floor._4_4_ < (int)sVar4; floor._4_4_ = floor._4_4_ + 1) {
    dVar1 = histogram->min;
    poVar3 = (ostream *)
             std::ostream::operator<<(&std::cout,dVar6 * (double)floor._4_4_ + histogram->min);
    poVar3 = std::operator<<(poVar3,'-');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6 * (double)(floor._4_4_ + 1) + dVar1);
    poVar3 = std::operator<<(poVar3,": ");
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                       (&histogram->bins,(long)floor._4_4_);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar5);
    std::operator<<(poVar3,'\n');
  }
  std::ios::copyfmt((ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  std::ios::~ios(local_120);
  return;
}

Assistant:

void print_histogram(Histogram const& histogram, std::string const& name) {
  std::ios saved_state(nullptr);
  saved_state.copyfmt(std::cout);
  std::cout << std::fixed << std::setprecision(2);
  std::cout << name << " histogram:\n";
  auto nbins = Int(histogram.bins.size());
  auto interval = (histogram.max - histogram.min) / Real(nbins);
  for (Int i = 0; i < nbins; ++i) {
    auto floor = interval * i + histogram.min;
    auto ceil = interval * (i + 1) + histogram.min;
    std::cout << floor << '-' << ceil << ": " << histogram.bins[std::size_t(i)]
              << '\n';
  }
  std::cout.copyfmt(saved_state);
}